

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_Brep::ReadOld101(ON_Brep *this,ON_BinaryArchive *file)

{
  ON_CurveProxy *this_00;
  ON_SurfaceProxy *this_01;
  ON_BrepVertex *pOVar1;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepFace *pOVar4;
  long lVar5;
  uint uVar6;
  ON_Curve *pOVar7;
  ON_Surface *proxy_surface;
  ON_BrepLoop *pOVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int count;
  ON_Object *pO;
  ON_Curve *pC;
  ON_Surface *pS;
  uint local_4c;
  ON_Object *local_48;
  ON_Curve *local_40;
  ON_Surface *local_38;
  
  local_48 = (ON_Object *)0x0;
  local_40 = (ON_Curve *)0x0;
  local_38 = (ON_Surface *)0x0;
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  if ((uint)(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_4c) {
    ON_SimpleArray<ON_Curve_*>::SetCapacity
              (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_4c);
  }
  if (0 < (int)local_4c) {
    iVar9 = 0;
    do {
      local_48 = (ON_Object *)0x0;
      ON_BinaryArchive::ReadObject(file,&local_48);
      local_40 = ON_Curve::Cast(local_48);
      if ((local_40 == (ON_Curve *)0x0) && (local_48 != (ON_Object *)0x0)) {
        (*local_48->_vptr_ON_Object[4])();
      }
      ON_SimpleArray<ON_Curve_*>::Append(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,&local_40);
      local_40 = (ON_Curve *)0x0;
      local_48 = (ON_Object *)0x0;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  if ((uint)(this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_capacity < local_4c) {
    ON_SimpleArray<ON_Curve_*>::SetCapacity
              (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)(int)local_4c);
  }
  if (0 < (int)local_4c) {
    iVar9 = 0;
    do {
      local_48 = (ON_Object *)0x0;
      ON_BinaryArchive::ReadObject(file,&local_48);
      local_40 = ON_Curve::Cast(local_48);
      if ((local_40 == (ON_Curve *)0x0) && (local_48 != (ON_Object *)0x0)) {
        (*local_48->_vptr_ON_Object[4])();
      }
      ON_SimpleArray<ON_Curve_*>::Append(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,&local_40);
      local_40 = (ON_Curve *)0x0;
      local_48 = (ON_Object *)0x0;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  if ((uint)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_capacity < local_4c) {
    ON_SimpleArray<ON_Surface_*>::SetCapacity
              (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,(long)(int)local_4c);
  }
  if (0 < (int)local_4c) {
    iVar9 = 0;
    do {
      local_48 = (ON_Object *)0x0;
      ON_BinaryArchive::ReadObject(file,&local_48);
      local_38 = ON_Surface::Cast(local_48);
      if ((local_38 == (ON_Surface *)0x0) && (local_48 != (ON_Object *)0x0)) {
        (*local_48->_vptr_ON_Object[4])();
      }
      ON_SimpleArray<ON_Surface_*>::Append
                (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,&local_38);
      local_38 = (ON_Surface *)0x0;
      local_48 = (ON_Object *)0x0;
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  uVar6 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
          m_capacity;
  if (uVar6 < local_4c) {
    ON_ClassArray<ON_BrepVertex>::SetCapacity
              ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,(long)(int)local_4c);
    uVar6 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
            m_capacity;
  }
  if ((-1 < (int)local_4c) && ((int)local_4c <= (int)uVar6)) {
    (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count =
         local_4c;
  }
  if (0 < (int)local_4c) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_a;
      (**(code **)(*(long *)((long)&(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar11) + 0x58))
                ((long)&(pOVar1->super_ON_Point).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                 lVar11,file);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x58;
    } while (lVar10 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  uVar6 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_capacity;
  if (uVar6 < local_4c) {
    ON_ClassArray<ON_BrepEdge>::SetCapacity
              ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,(long)(int)local_4c);
    uVar6 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
            m_capacity;
  }
  if ((-1 < (int)local_4c) && ((int)local_4c <= (int)uVar6)) {
    (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count =
         local_4c;
  }
  if (0 < (int)local_4c) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      this_00 = (ON_CurveProxy *)
                ((long)&(((ON_CurveProxy *)(&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2)
                         )->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                lVar10);
      (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                     (&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                    super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar10) + 0x58))(this_00);
      lVar5 = (long)*(int *)((long)pOVar2->m_vi + lVar10 + -4);
      if (lVar5 < 0) {
        pOVar7 = (ON_Curve *)0x0;
      }
      else {
        pOVar7 = (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar5];
      }
      ON_CurveProxy::SetProxyCurve(this_00,pOVar7);
      *(ON_Brep **)((long)pOVar2->m_vi + lVar10 + 0x2c) = this;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x88;
    } while (lVar11 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  uVar6 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_capacity;
  if (uVar6 < local_4c) {
    ON_ClassArray<ON_BrepTrim>::SetCapacity
              ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,(long)(int)local_4c);
    uVar6 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
            m_capacity;
  }
  if ((-1 < (int)local_4c) && ((int)local_4c <= (int)uVar6)) {
    (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count =
         local_4c;
  }
  if (0 < (int)local_4c) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                     (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                    super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar11) + 0x58))
                ((long)&(((ON_CurveProxy *)(&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2)
                         )->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                 lVar11);
      pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      lVar5 = (long)*(int *)((long)pOVar3->m_vi + lVar11 + -8);
      if (lVar5 < 0) {
        pOVar7 = (ON_Curve *)0x0;
      }
      else {
        pOVar7 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar5];
      }
      ON_CurveProxy::SetProxyCurve
                ((ON_CurveProxy *)
                 ((long)&(((ON_CurveProxy *)
                          (&(pOVar3->super_ON_CurveProxy).m_real_curve_domain + -2))->super_ON_Curve
                         ).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar11),pOVar7);
      *(ON_Brep **)((long)pOVar3->m_tolerance + lVar11 + 0x70) = this;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xe8;
    } while (lVar10 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  uVar6 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_capacity;
  if (uVar6 < local_4c) {
    ON_ClassArray<ON_BrepLoop>::SetCapacity
              ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,(long)(int)local_4c);
    uVar6 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
            m_capacity;
  }
  if ((-1 < (int)local_4c) && ((int)local_4c <= (int)uVar6)) {
    (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count =
         local_4c;
  }
  if (0 < (int)local_4c) {
    pOVar8 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    lVar11 = 0;
    lVar10 = 0;
    do {
      (**(code **)(*(long *)((long)&(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object +
                            lVar11) + 0x58))
                ((long)&(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object + lVar11,file);
      pOVar8 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      *(ON_Brep **)((long)&pOVar8->m_brep + lVar11) = this;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x78;
    } while (lVar10 < (int)local_4c);
  }
  ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_4c);
  uVar6 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_capacity;
  if (uVar6 < local_4c) {
    ON_ClassArray<ON_BrepFace>::SetCapacity
              ((ON_ClassArray<ON_BrepFace> *)&this->m_F,(long)(int)local_4c);
    uVar6 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
            m_capacity;
  }
  if ((-1 < (int)local_4c) && ((int)local_4c <= (int)uVar6)) {
    (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count =
         local_4c;
  }
  if (0 < (int)local_4c) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pOVar4 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
      this_01 = (ON_SurfaceProxy *)((pOVar4->m_face_uuid).Data4 + lVar10 + -0x5c);
      (**(code **)(*(long *)((pOVar4->m_face_uuid).Data4 + lVar10 + -0x5c) + 0x58))(this_01);
      lVar5 = (long)*(int *)((pOVar4->m_face_uuid).Data4 + lVar10 + -0x14);
      if (lVar5 < 0) {
        proxy_surface = (ON_Surface *)0x0;
      }
      else {
        proxy_surface = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[lVar5];
      }
      ON_SurfaceProxy::SetProxySurface(this_01,proxy_surface);
      *(ON_Brep **)((long)(&pOVar4->m_face_uuid + 7) + lVar10 + 0xc) = this;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xd8;
    } while (lVar11 < (int)local_4c);
  }
  ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_min);
  ON_BinaryArchive::ReadPoint(file,&(this->m_bbox).m_max);
  ReadFillInMissingBoxes(this);
  return true;
}

Assistant:

bool ON_Brep::ReadOld101( ON_BinaryArchive& file )
{
  ON_Object*  pO = nullptr;
  ON_Curve*   pC = nullptr;
  ON_Surface* pS = nullptr;
  int i, count;

  // 2d curves
  file.ReadInt( &count );
  m_C2.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pC = ON_Curve::Cast(pO);
    if ( !pC )
      delete pO; // ERROR!
    m_C2.Append( pC );
    pC = nullptr;
    pO = nullptr;
  }

  // 3d curves
  file.ReadInt( &count );
  m_C3.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pC = ON_Curve::Cast(pO);
    if ( !pC )
      delete pO; // ERROR!
    m_C3.Append( pC );
    pC = nullptr;
    pO = nullptr;
  }

  // untrimmed surfaces
  file.ReadInt( &count );
  m_S.Reserve(count);
  for ( i = 0; i < count; i++ ) 
  {
    pO = nullptr;
    file.ReadObject( &pO );
    pS = ON_Surface::Cast(pO);
    if ( !pS )
      delete pO; // ERROR!
    m_S.Append( pS );
    pS = nullptr;
    pO = nullptr;
  }

  // vertices
  file.ReadInt( &count );
  m_V.Reserve(count);
  m_V.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_V[i].Read(file);
  }

  // edges
  file.ReadInt( &count );
  m_E.Reserve(count);
  m_E.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepEdge& edge = m_E[i];
    edge.Read(file);
    edge.SetProxyCurve( edge.m_c3i >= 0 ? m_C3[edge.m_c3i] : 0 );
    edge.m_brep = this;
  }

  // trims
  file.ReadInt( &count );
  m_T.Reserve(count);
  m_T.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_T[i].Read(file);
    ON_BrepTrim& trim = m_T[i];
    trim.SetProxyCurve( trim.m_c2i >= 0 ? m_C2[trim.m_c2i] : 0 );
    trim.m_brep = this;
  }

  // loops
  file.ReadInt( &count );
  m_L.Reserve(count);
  m_L.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    m_L[i].Read(file);
    m_L[i].m_brep = this;
  }

  // faces
  file.ReadInt( &count );
  m_F.Reserve(count);
  m_F.SetCount(count);
  for ( i = 0; i < count; i++ ) 
  {
    ON_BrepFace& face = m_F[i];
    face.Read(file);
    face.SetProxySurface(face.m_si >= 0 ? m_S[face.m_si] : 0);
    face.m_brep = this;
  }

  // bounding box
  file.ReadPoint( m_bbox.m_min );
  file.ReadPoint( m_bbox.m_max );

  // fill in missing information
  ReadFillInMissingBoxes(*this);

  return true;
}